

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O2

_Bool line_comment_herald(Env *env)

{
  _Bool _Var1;
  bool bVar2;
  int32_t iVar3;
  uint32_t rel;
  
  _Var1 = seq(env,"--");
  if (_Var1) {
    rel = 1;
    do {
      rel = rel + 1;
      iVar3 = peek(env,rel);
    } while (iVar3 == 0x2d);
    iVar3 = peek(env,rel);
    _Var1 = symop_char(iVar3);
    bVar2 = !_Var1;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

static bool line_comment_herald(Env *env) {
  return seq(env, "--") && only_minus(env);
}